

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

tuple<glslang::TBasicType,_glslang::TBasicType> __thiscall
glslang::TIntermediate::getConversionDestinationType
          (TIntermediate *this,TBasicType type0,TBasicType type1,TOperator op)

{
  bool bVar1;
  EShSource EVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000034;
  TIntermediate *this_00;
  TBasicType in_R8D;
  TBasicType local_28;
  TBasicType res1;
  TBasicType res0;
  TOperator op_local;
  TBasicType type1_local;
  TBasicType type0_local;
  TIntermediate *this_local;
  
  this_00 = (TIntermediate *)CONCAT44(in_register_00000034,type0);
  local_28 = EbtNumTypes;
  res1 = in_R8D;
  res0 = op;
  op_local = type1;
  _type1_local = this_00;
  this_local = this;
  bVar1 = isEsProfile(this_00);
  if (((bVar1) &&
      ((this_00->version < 0x136 ||
       (bVar1 = TNumericFeatures::contains(&this_00->numericFeatures,shader_implicit_conversions),
       !bVar1)))) || (this_00->version == 0x6e)) {
    std::make_tuple<glslang::TBasicType&,glslang::TBasicType&>(&this->language,&local_28);
    return (tuple<glslang::TBasicType,_glslang::TBasicType>)
           (_Tuple_impl<0UL,_glslang::TBasicType,_glslang::TBasicType>)this;
  }
  EVar2 = getSource(this_00);
  if (EVar2 == EShSourceHlsl) {
    bVar1 = canImplicitlyPromote(this_00,res0,op_local,res1);
    if (bVar1) {
      local_28 = op_local;
    }
    else {
      bVar1 = canImplicitlyPromote(this_00,op_local,res0,res1);
      if (bVar1) {
        local_28 = res0;
      }
    }
    std::make_tuple<glslang::TBasicType&,glslang::TBasicType&>(&this->language,&local_28);
    return (tuple<glslang::TBasicType,_glslang::TBasicType>)
           (_Tuple_impl<0UL,_glslang::TBasicType,_glslang::TBasicType>)this;
  }
  if (((op_local == EOpScope) && (bVar1 = canImplicitlyPromote(this_00,res0,EbtDouble,res1), bVar1))
     || ((res0 == EbtDouble &&
         (bVar1 = canImplicitlyPromote(this_00,op_local,EbtDouble,res1), bVar1)))) {
    local_28 = EbtDouble;
  }
  else if (((op_local == EOpSequence) &&
           (bVar1 = canImplicitlyPromote(this_00,res0,EbtFloat,res1), bVar1)) ||
          ((res0 == EbtFloat &&
           (bVar1 = canImplicitlyPromote(this_00,op_local,EbtFloat,res1), bVar1)))) {
    local_28 = EbtFloat;
  }
  else if (((op_local == EOpLinkerObjects) &&
           (bVar1 = canImplicitlyPromote(this_00,res0,EbtFloat16,res1), bVar1)) ||
          ((res0 == EbtFloat16 &&
           (bVar1 = canImplicitlyPromote(this_00,op_local,EbtFloat16,res1), bVar1)))) {
    local_28 = EbtFloat16;
  }
  else {
    bVar1 = isTypeInt(op_local);
    if (((bVar1) && (bVar1 = isTypeInt(res0), bVar1)) &&
       ((bVar1 = canImplicitlyPromote(this_00,op_local,res0,res1), bVar1 ||
        (bVar1 = canImplicitlyPromote(this_00,res0,op_local,res1), bVar1)))) {
      bVar1 = isTypeSignedInt(op_local);
      if (((bVar1) && (bVar1 = isTypeSignedInt(res0), bVar1)) ||
         ((bVar1 = isTypeUnsignedInt(op_local), bVar1 && (bVar1 = isTypeUnsignedInt(res0), bVar1))))
      {
        iVar3 = getTypeRank(op_local);
        iVar4 = getTypeRank(res0);
        if (iVar3 < iVar4) {
          local_28 = res0;
        }
        else {
          local_28 = op_local;
        }
      }
      else {
        bVar1 = isTypeUnsignedInt(op_local);
        if (bVar1) {
          iVar3 = getTypeRank(op_local);
          iVar4 = getTypeRank(res0);
          if (iVar4 < iVar3) {
            local_28 = op_local;
            goto LAB_0066ad25;
          }
        }
        bVar1 = isTypeUnsignedInt(res0);
        if (bVar1) {
          iVar3 = getTypeRank(res0);
          iVar4 = getTypeRank(op_local);
          if (iVar4 < iVar3) {
            local_28 = res0;
            goto LAB_0066ad25;
          }
        }
        bVar1 = isTypeSignedInt(op_local);
        if (bVar1) {
          bVar1 = canSignedIntTypeRepresentAllUnsignedValues(op_local,res0);
          if (bVar1) {
            local_28 = op_local;
          }
          else {
            local_28 = getCorrespondingUnsignedType(op_local);
            getCorrespondingUnsignedType(op_local);
          }
        }
        else {
          bVar1 = isTypeSignedInt(res0);
          if (bVar1) {
            bVar1 = canSignedIntTypeRepresentAllUnsignedValues(res0,op_local);
            if (bVar1) {
              local_28 = res0;
            }
            else {
              local_28 = getCorrespondingUnsignedType(res0);
              getCorrespondingUnsignedType(res0);
            }
          }
        }
      }
    }
  }
LAB_0066ad25:
  std::make_tuple<glslang::TBasicType&,glslang::TBasicType&>(&this->language,&local_28);
  return (tuple<glslang::TBasicType,_glslang::TBasicType>)
         (_Tuple_impl<0UL,_glslang::TBasicType,_glslang::TBasicType>)this;
}

Assistant:

std::tuple<TBasicType, TBasicType> TIntermediate::getConversionDestinationType(TBasicType type0, TBasicType type1, TOperator op) const
{
    TBasicType res0 = EbtNumTypes;
    TBasicType res1 = EbtNumTypes;

    if ((isEsProfile() && 
        (version < 310 || !numericFeatures.contains(TNumericFeatures::shader_implicit_conversions))) || 
        version == 110)
        return std::make_tuple(res0, res1);

    if (getSource() == EShSourceHlsl) {
        if (canImplicitlyPromote(type1, type0, op)) {
            res0 = type0;
            res1 = type0;
        } else if (canImplicitlyPromote(type0, type1, op)) {
            res0 = type1;
            res1 = type1;
        }
        return std::make_tuple(res0, res1);
    }

    if ((type0 == EbtDouble && canImplicitlyPromote(type1, EbtDouble, op)) ||
        (type1 == EbtDouble && canImplicitlyPromote(type0, EbtDouble, op)) ) {
        res0 = EbtDouble;
        res1 = EbtDouble;
    } else if ((type0 == EbtFloat && canImplicitlyPromote(type1, EbtFloat, op)) ||
               (type1 == EbtFloat && canImplicitlyPromote(type0, EbtFloat, op)) ) {
        res0 = EbtFloat;
        res1 = EbtFloat;
    } else if ((type0 == EbtFloat16 && canImplicitlyPromote(type1, EbtFloat16, op)) ||
               (type1 == EbtFloat16 && canImplicitlyPromote(type0, EbtFloat16, op)) ) {
        res0 = EbtFloat16;
        res1 = EbtFloat16;
    } else if (isTypeInt(type0) && isTypeInt(type1) &&
               (canImplicitlyPromote(type0, type1, op) || canImplicitlyPromote(type1, type0, op))) {
        if ((isTypeSignedInt(type0) && isTypeSignedInt(type1)) ||
            (isTypeUnsignedInt(type0) && isTypeUnsignedInt(type1))) {
            if (getTypeRank(type0) < getTypeRank(type1)) {
                res0 = type1;
                res1 = type1;
            } else {
                res0 = type0;
                res1 = type0;
            }
        } else if (isTypeUnsignedInt(type0) && (getTypeRank(type0) > getTypeRank(type1))) {
            res0 = type0;
            res1 = type0;
        } else if (isTypeUnsignedInt(type1) && (getTypeRank(type1) > getTypeRank(type0))) {
            res0 = type1;
            res1 = type1;
        } else if (isTypeSignedInt(type0)) {
            if (canSignedIntTypeRepresentAllUnsignedValues(type0, type1)) {
                res0 = type0;
                res1 = type0;
            } else {
                res0 = getCorrespondingUnsignedType(type0);
                res1 = getCorrespondingUnsignedType(type0);
            }
        } else if (isTypeSignedInt(type1)) {
            if (canSignedIntTypeRepresentAllUnsignedValues(type1, type0)) {
                res0 = type1;
                res1 = type1;
            } else {
                res0 = getCorrespondingUnsignedType(type1);
                res1 = getCorrespondingUnsignedType(type1);
            }
        }
    }

    return std::make_tuple(res0, res1);
}